

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

bool __thiscall Wasm::PolymorphicEmitInfo::IsUnreachable(PolymorphicEmitInfo *this)

{
  uint local_1c;
  uint32 i;
  PolymorphicEmitInfo *this_local;
  
  if (this->count == 0) {
    this_local._7_1_ = false;
  }
  else if (this->count == 1) {
    this_local._7_1_ = (this->field_1).singleInfo.type == Any;
  }
  else {
    for (local_1c = 0; local_1c < this->count; local_1c = local_1c + 1) {
      if ((this->field_1).infos[local_1c].type == Any) {
        return true;
      }
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool PolymorphicEmitInfo::IsUnreachable() const
{
    if (count == 0)
    {
        return false;
    }
    if (count == 1)
    {
        return singleInfo.type == WasmTypes::Any;
    }
    for (uint32 i = 0; i < count; ++i)
    {
        if (infos[i].type == WasmTypes::Any)
        {
            return true;
        }
    }
    return false;
}